

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O2

void deqp::gls::StateQueryUtil::verifyFloatMin
               (ResultCollector *result,QueriedState *state,float minValue)

{
  ostream *poVar1;
  float fVar2;
  ostringstream buf;
  string local_1c0;
  string local_1a0 [11];
  
  switch(state->m_type) {
  case DATATYPE_BOOLEAN:
    if (minValue <= 0.0) {
      return;
    }
    if ((state->m_v).vBool != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a0,"expected GL_TRUE, got GL_FALSE",(allocator<char> *)&local_1c0);
    tcu::ResultCollector::fail(result,local_1a0);
    std::__cxx11::string::~string((string *)local_1a0);
    return;
  case DATATYPE_INTEGER:
    fVar2 = ceilf(minValue + -0.5);
    if ((int)fVar2 <= (state->m_v).vInt) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    poVar1 = std::operator<<((ostream *)local_1a0,"Expected greater or equal to ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)fVar2);
    poVar1 = std::operator<<(poVar1,", got ");
    std::ostream::operator<<(poVar1,(state->m_v).vInt);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1c0);
    break;
  case DATATYPE_INTEGER64:
    fVar2 = ceilf(minValue + -0.5);
    if ((long)fVar2 <= (state->m_v).vInt64) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    poVar1 = std::operator<<((ostream *)local_1a0,"Expected greater or equal to ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    poVar1 = std::operator<<(poVar1,", got ");
    std::ostream::_M_insert<long>((long)poVar1);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1c0);
    break;
  case DATATYPE_FLOAT:
    if ((minValue <= (state->m_v).vFloat) && (!NAN((state->m_v).vFloat))) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    poVar1 = std::operator<<((ostream *)local_1a0,"Expected greater or equal to ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,minValue);
    poVar1 = std::operator<<(poVar1,", got ");
    std::ostream::operator<<(poVar1,(state->m_v).vFloat);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1c0);
    break;
  default:
    goto switchD_004559b8_default;
  }
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
switchD_004559b8_default:
  return;
}

Assistant:

DataType QueriedState::getType (void) const
{
	return m_type;
}